

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O2

ssize_t __thiscall
helics::Endpoint::send(Endpoint *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  Core *pCVar2;
  ssize_t extraout_RAX;
  InvalidFunctionCall *this_00;
  undefined4 in_register_00000034;
  _Head_base<0UL,_helics::Message_*,_false> *p_Var3;
  string_view message;
  __uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> local_18;
  
  p_Var3 = (_Head_base<0UL,_helics::Message_*,_false> *)CONCAT44(in_register_00000034,__fd);
  if ((*(char *)((long)&(this->fed->mfManager)._M_t.
                        super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                        .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl
                + (long)this->fed->_vptr_MessageFederate[-3]) != '\x02') &&
     (*(char *)((long)&(this->fed->mfManager)._M_t.
                       super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
                       .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl
               + (long)this->fed->_vptr_MessageFederate[-3]) != '\x01')) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "messages not allowed outside of execution and initialization mode";
    message._M_len = 0x41;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  local_18._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
       (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)p_Var3->_M_head_impl;
  if ((((Message *)
       local_18._M_t.
       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
       super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->dest)._M_string_length == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &((Message *)
                local_18._M_t.
                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->dest,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->defDest);
    local_18._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)p_Var3->_M_head_impl;
  }
  pCVar2 = (this->super_Interface).mCore;
  uVar1 = (this->super_Interface).handle.hid;
  p_Var3->_M_head_impl = (Message *)0x0;
  (*pCVar2->_vptr_Core[0x4e])(pCVar2,(ulong)uVar1);
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_18);
  return extraout_RAX;
}

Assistant:

void Endpoint::send(std::unique_ptr<Message> mess) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        if (mess->dest.empty()) {
            mess->dest = defDest;
        }
        mCore->sendMessage(handle, std::move(mess));
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}